

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O3

bool cmGetDirectoryPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  int iVar1;
  PolicyStatus PVar2;
  string *psVar3;
  cmGlobalGenerator *this;
  cmMakefile *pcVar4;
  char *pcVar5;
  size_type sVar6;
  pointer __s;
  PolicyID id;
  cmMakefile *this_00;
  string_view value;
  string sd;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name) < 0x21) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    psVar3 = name + 1;
    pcVar4 = status->Makefile;
    iVar1 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar1 == 0) {
      if (name + 2 !=
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
        cmsys::SystemTools::CollapseFullPath(&local_68,name + 2,psVar3);
        this = cmMakefile::GetGlobalGenerator(status->Makefile);
        pcVar4 = cmGlobalGenerator::FindMakefile(this,&local_68);
        if (pcVar4 == (cmMakefile *)0x0) {
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_48,
                     "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                     ,"");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          psVar3 = name + 3;
          if (psVar3 != (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            goto LAB_003789a0;
          }
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_48,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return false;
        }
        goto LAB_0037896f;
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"DIRECTORY argument provided without subsequent arguments","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
LAB_003789a0:
      iVar1 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar1 == 0) {
        if (psVar3 + 1 !=
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          psVar3 = cmMakefile::GetSafeDefinition(pcVar4,psVar3 + 1);
          this_00 = status->Makefile;
          __s = (psVar3->_M_dataplus)._M_p;
          sVar6 = psVar3->_M_string_length;
          goto LAB_00378a9d;
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "A request for a variable definition was made without providing the name of the variable to get."
                   ,"");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        if (psVar3->_M_string_length != 0) {
          iVar1 = std::__cxx11::string::compare((char *)psVar3);
          if (iVar1 == 0) {
            PVar2 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0059,false);
            if (PVar2 != OLD) {
              if (PVar2 != WARN) goto LAB_003789d9;
              pcVar4 = status->Makefile;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_68,(cmPolicies *)&DAT_0000003b,id);
              cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            this_00 = status->Makefile;
            pcVar5 = cmMakefile::GetDefineFlagsCMP0059(this_00);
            __s = "";
            if (pcVar5 != (char *)0x0) {
              __s = pcVar5;
            }
            sVar6 = strlen(__s);
          }
          else {
LAB_003789d9:
            this_00 = status->Makefile;
            psVar3 = (string *)cmMakefile::GetProperty(pcVar4,psVar3);
            if (psVar3 == (string *)0x0) {
              psVar3 = &cmValue::Empty_abi_cxx11_;
            }
            __s = (psVar3->_M_dataplus)._M_p;
            sVar6 = psVar3->_M_string_length;
          }
LAB_00378a9d:
          value._M_str = __s;
          value._M_len = sVar6;
          cmMakefile::AddDefinition(this_00,name,value);
          return true;
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"given empty string for the property name to get","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return false;
  }
LAB_0037896f:
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmGetDirectoryPropertyCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto i = args.begin();
  std::string const& variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile* dir = &status.GetMakefile();
  if (*i == "DIRECTORY") {
    ++i;
    if (i == args.end()) {
      status.SetError(
        "DIRECTORY argument provided without subsequent arguments");
      return false;
    }
    std::string sd = cmSystemTools::CollapseFullPath(
      *i, status.GetMakefile().GetCurrentSourceDirectory());

    // lookup the makefile from the directory name
    dir = status.GetMakefile().GetGlobalGenerator()->FindMakefile(sd);
    if (!dir) {
      status.SetError(
        "DIRECTORY argument provided but requested directory not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
    ++i;
    if (i == args.end()) {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if (*i == "DEFINITION") {
    ++i;
    if (i == args.end()) {
      status.SetError("A request for a variable definition was made without "
                      "providing the name of the variable to get.");
      return false;
    }
    std::string const& output = dir->GetSafeDefinition(*i);
    status.GetMakefile().AddDefinition(variable, output);
    return true;
  }

  if (i->empty()) {
    status.SetError("given empty string for the property name to get");
    return false;
  }

  if (*i == "DEFINITIONS") {
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0059)) {
      case cmPolicies::WARN:
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        StoreResult(status.GetMakefile(), variable,
                    status.GetMakefile().GetDefineFlagsCMP0059());
        return true;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
    }
  }
  StoreResult(status.GetMakefile(), variable, dir->GetProperty(*i));
  return true;
}